

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O0

int tnt_schema_add_spaces(tnt_schema *schema_obj,tnt_reply *r)

{
  int iVar1;
  uint local_44;
  byte *pbStack_40;
  uint32_t space_count;
  char *tuple;
  mh_assoc_t *schema;
  tnt_reply *r_local;
  tnt_schema *schema_obj_local;
  char **ppcStack_18;
  uint8_t c;
  uint local_c;
  
  tuple = (char *)schema_obj->space_hash;
  pbStack_40 = (byte *)r->data;
  schema = (mh_assoc_t *)r;
  r_local = (tnt_reply *)schema_obj;
  iVar1 = mp_check((char **)&stack0xffffffffffffffc0,
                   (char *)pbStack_40 + ((long)r->data_end - (long)r->data));
  if (iVar1 == 0) {
    pbStack_40 = *(byte **)&schema[1].n_buckets;
    schema_obj_local._6_1_ = *pbStack_40;
    if (mp_type_hint[schema_obj_local._6_1_] == MP_ARRAY) {
      ppcStack_18 = (char **)&stack0xffffffffffffffc0;
      schema_obj_local._7_1_ = mp_load_u8(ppcStack_18);
      if ((schema_obj_local._7_1_ & 0x40) == 0) {
        local_c = schema_obj_local._7_1_ & 0xf;
      }
      else {
        local_c = mp_decode_array_slowpath(schema_obj_local._7_1_,ppcStack_18);
      }
      local_44 = local_c;
      do {
        if (local_44 == 0) {
          return 0;
        }
        iVar1 = tnt_schema_add_space((mh_assoc_t *)tuple,(char **)&stack0xffffffffffffffc0);
        local_44 = local_44 - 1;
      } while (iVar1 == 0);
    }
  }
  return -1;
}

Assistant:

int tnt_schema_add_spaces(struct tnt_schema *schema_obj, struct tnt_reply *r) {
	struct mh_assoc_t *schema = schema_obj->space_hash;
	const char *tuple = r->data;
	if (mp_check(&tuple, tuple + (r->data_end - r->data)))
		return -1;
	tuple = r->data;
	if (mp_typeof(*tuple) != MP_ARRAY)
		return -1;
	uint32_t space_count = mp_decode_array(&tuple);
	while (space_count-- > 0) {
		if (tnt_schema_add_space(schema, &tuple))
			return -1;
	}
	return 0;
}